

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

void acutest_case_(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  va_list args;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (1 < acutest_verbose_level_) {
    if (acutest_case_name_[0] != '\0') {
      acutest_case_already_logged_ = 0;
      acutest_case_name_[0] = '\0';
    }
    if (fmt != (char *)0x0) {
      args[0].overflow_arg_area = local_d8;
      args[0]._0_8_ = &stack0x00000008;
      local_28 = 0x3000000008;
      local_d0 = in_RSI;
      local_c8 = in_RDX;
      local_c0 = in_RCX;
      local_b8 = in_R8;
      local_b0 = in_R9;
      vsnprintf(acutest_case_name_,0x3f,fmt,&local_28);
      acutest_case_name_[0x3f] = '\0';
      if (2 < acutest_verbose_level_) {
        acutest_line_indent_(1);
        acutest_colored_printf_(10,"Case %s:\n",acutest_case_name_);
        acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
        acutest_case_already_logged_ = acutest_case_already_logged_ + 1;
      }
    }
  }
  return;
}

Assistant:

acutest_case_(const char* fmt, ...)
{
    va_list args;

    if(acutest_verbose_level_ < 2)
        return;

    if(acutest_case_name_[0]) {
        acutest_case_already_logged_ = 0;
        acutest_case_name_[0] = '\0';
    }

    if(fmt == NULL)
        return;

    va_start(args, fmt);
    vsnprintf(acutest_case_name_, sizeof(acutest_case_name_) - 1, fmt, args);
    va_end(args);
    acutest_case_name_[sizeof(acutest_case_name_) - 1] = '\0';

    if(acutest_verbose_level_ >= 3) {
        acutest_line_indent_(1);
        acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Case %s:\n", acutest_case_name_);
        acutest_test_already_logged_++;
        acutest_case_already_logged_++;
    }
}